

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O2

size_t __thiscall docopt::LeafPattern::hash(LeafPattern *this)

{
  size_t local_20;
  size_t seed;
  
  local_20 = std::type_info::hash_code((type_info *)(this->super_Pattern)._vptr_Pattern[-1]);
  hash_combine<std::__cxx11::string>(&local_20,&this->fName);
  hash_combine<docopt::value>(&local_20,&this->fValue);
  return local_20;
}

Assistant:

virtual size_t hash() const override {
			size_t seed = typeid(*this).hash_code();
			hash_combine(seed, fName);
			hash_combine(seed, fValue);
			return seed;
		}